

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_nix.c
# Opt level: O0

int katherine_udp_init(katherine_udp_t *u,uint16_t param_2,char *remote_addr,uint16_t remote_port,
                      uint32_t timeout_ms)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  int *piVar4;
  ulong local_48;
  timeval timeout;
  int res;
  uint32_t timeout_ms_local;
  uint16_t remote_port_local;
  char *remote_addr_local;
  uint16_t local_port_local;
  katherine_udp_t *u_local;
  
  timeout.tv_usec._4_4_ = 0;
  iVar2 = socket(2,2,0x11);
  u->sock = iVar2;
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    return *piVar4;
  }
  (u->addr_local).sin_family = 2;
  uVar1 = htons(param_2);
  (u->addr_local).sin_port = uVar1;
  uVar3 = htonl(0);
  (u->addr_local).sin_addr.s_addr = uVar3;
  iVar2 = bind(u->sock,(sockaddr *)&u->addr_local,0x10);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    timeout.tv_usec._4_4_ = *piVar4;
  }
  else {
    if (timeout_ms != 0) {
      local_48 = (ulong)timeout_ms / 1000;
      timeout.tv_sec = (__time_t)((timeout_ms % 1000) * 1000);
      iVar2 = setsockopt(u->sock,1,0x14,&local_48,0x10);
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        timeout.tv_usec._4_4_ = *piVar4;
        goto LAB_0010663f;
      }
    }
    (u->addr_remote).sin_family = 2;
    uVar1 = htons(remote_port);
    (u->addr_remote).sin_port = uVar1;
    iVar2 = inet_pton(2,remote_addr,&(u->addr_remote).sin_addr);
    if (iVar2 < 1) {
      timeout.tv_usec._4_4_ = 0x16;
    }
    else {
      timeout.tv_usec._4_4_ =
           pthread_mutex_init((pthread_mutex_t *)&u->mutex,(pthread_mutexattr_t *)0x0);
      if (timeout.tv_usec._4_4_ == 0) {
        return 0;
      }
    }
  }
LAB_0010663f:
  close(u->sock);
  return timeout.tv_usec._4_4_;
}

Assistant:

int
katherine_udp_init(katherine_udp_t *u, uint16_t local_port, const char *remote_addr, uint16_t remote_port, uint32_t timeout_ms)
{
    int res = 0;

    // Create socket.
    if ((u->sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP)) == -1) {
        res = errno;
        goto err_socket;
    }

    // Setup and bind the socket address.
    u->addr_local.sin_family = AF_INET;
    u->addr_local.sin_port = htons(local_port);
    u->addr_local.sin_addr.s_addr = htonl(INADDR_ANY);

    if (bind(u->sock, (struct sockaddr*) &u->addr_local, sizeof(u->addr_local)) == -1) {
        res = errno;
        goto err_bind;
    }

    if (timeout_ms > 0) {
        // Set socket timeout.
        struct timeval timeout;
        timeout.tv_sec = timeout_ms / 1000;
        timeout.tv_usec = 1000 * (timeout_ms % 1000);
        if (setsockopt(u->sock, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout)) == -1) {
            res = errno;
            goto err_timeout;
        }
    }

    // Set remote socket address.
    u->addr_remote.sin_family = AF_INET;
    u->addr_remote.sin_port = htons(remote_port);
    if (inet_pton(AF_INET, remote_addr, &u->addr_remote.sin_addr) <= 0) {
        res = EINVAL;
        goto err_remote;
    }

    if ((res = pthread_mutex_init(&u->mutex, NULL)) != 0) {
        goto err_mutex;
    }

    return res;

err_mutex:
err_remote:
err_timeout:
err_bind:
    close(u->sock);
err_socket:
    return res;
}